

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void vfmsub213ps_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  byte bVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  UVar1 = (pMyDisasm->Reserved_).EVEX.state;
  if ((UVar1 == '\x01') && ((pMyDisasm->Reserved_).VEX.pp == '\x03')) {
    if (((pMyDisasm->Reserved_).EVEX.W == '\0') && ((pMyDisasm->Reserved_).VEX.L == '\x02')) {
      uVar5 = (pMyDisasm->Reserved_).EndOfBlock;
      if ((uVar5 != 0) && (uVar5 < (pMyDisasm->Reserved_).EIP_ + 2)) {
        (pMyDisasm->Reserved_).OutOfBlock = 1;
        (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
        return;
      }
      bVar2 = *(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
      (pMyDisasm->Reserved_).MOD_ = (uint)bVar2;
      if (((pMyDisasm->Reserved_).EVEX.b == '\x01') || (bVar2 == 3)) {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"v4fnmaddps",0xb);
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
      (pMyDisasm->Instruction).Category = 0x140000;
      (pMyDisasm->Reserved_).Register_ = 0x10;
      (pMyDisasm->Reserved_).MemDecoration = 0xd1;
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      uVar6 = ~(uint)(pMyDisasm->Reserved_).VEX.vvvv & 0xc;
      iVar4 = (uint)(pMyDisasm->Reserved_).EVEX.V * 0x80;
      uVar5 = (ulong)(iVar4 + uVar6 * 8);
      strcpy((pMyDisasm->Operand2).OpMnemonic,RegistersAVX512[0] + uVar5);
      sVar3 = strlen((pMyDisasm->Operand2).OpMnemonic);
      builtin_strncpy((pMyDisasm->Operand2).OpMnemonic + sVar3,"...",4);
      uVar7 = (ulong)(iVar4 + 0x18 + uVar6 * 8);
      strcpy((pMyDisasm->Operand2).OpMnemonic + sVar3 + 3,RegistersAVX512[0] + uVar7);
      (pMyDisasm->Operand2).OpType = 0x20000;
      (pMyDisasm->Operand2).Registers.type = 0x10;
      (pMyDisasm->Operand2).Registers.zmm =
           *(long *)((long)REGS + uVar5 + 8) + *(long *)((long)REGS + uVar5) +
           *(long *)((long)REGS + uVar5 + 0x10) + *(long *)((long)REGS + uVar7);
      (pMyDisasm->Operand2).OpSize = 0x200;
      decodeModrm(&pMyDisasm->Operand3,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      return;
    }
  }
  else if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    if (UVar1 == '\x01') {
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
    }
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      if (((UVar1 == '\x01') || ((pMyDisasm->Reserved_).REX.W_ != '\0')) &&
         ((UVar1 != '\x01' || ((pMyDisasm->Reserved_).EVEX.W != '\0')))) {
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vfmsub213pd",0xc);
      }
      else {
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vfmsub213ps",0xc);
      }
      ArgsVEX(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
      return;
    }
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ vfmsub213ps_(PDISASM pMyDisasm)
{
  size_t i;
  int index;
  if ((GV.EVEX.state == InUsePrefix) && (GV.VEX.pp == 3)) {
    if (GV.EVEX.W == 0) {
      if (GV.VEX.L == 2) {
        if (!Security(2, pMyDisasm)) return;
        GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
        if ((GV.EVEX.b == 1) || (GV.MOD_ == 3)) GV.ERROR_OPCODE = UD_;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "v4fnmaddps");
        #endif
        GV.EVEX.tupletype = TUPLE1_SCALAR;
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
        GV.Register_ = AVX512_REG;
        GV.MemDecoration = Arg3_m128_xmm;
        decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

        index = (~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V;
        index = (index / 4) * 4;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy ((char*) pMyDisasm->Operand2.OpMnemonic, RegistersAVX512[index]);
           i = strlen((char*) &pMyDisasm->Operand2.OpMnemonic);
           (void) strcpy ((char*) pMyDisasm->Operand2.OpMnemonic+i, "...");
           i+=3;
           (void) strcpy ((char*) pMyDisasm->Operand2.OpMnemonic+i, RegistersAVX512[index+3]);
        #endif

        pMyDisasm->Operand2.OpType = REGISTER_TYPE;
        pMyDisasm->Operand2.Registers.type = AVX512_REG;
        pMyDisasm->Operand2.Registers.zmm = REGS[index] + REGS[index+1] + REGS[index+2] + REGS[index+3];
        pMyDisasm->Operand2.OpSize = 512;

        decodeModrm(&pMyDisasm->Operand3, pMyDisasm);
        GV.EIP_ += GV.DECALAGE_EIP+2;
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
   /* ========== 0x66 */
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
       if (GV.VEX.state == InUsePrefix) {
         if (((GV.REX.W_ == 0x0) && (GV.EVEX.state != InUsePrefix)) || ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))) {
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vfmsub213ps");
           #endif
         } else {
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vfmsub213pd");
           #endif

         }
         ArgsVEX(pMyDisasm);
         pMyDisasm->Operand1.AccessMode = READ + WRITE;
       } else {
         failDecode(pMyDisasm);
       }
   }
   else {
       failDecode(pMyDisasm);
   }
}